

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_tests.cpp
# Opt level: O0

string * anon_unknown.dwarf_47aea5::UseHInsteadOfApostrophe(string *desc)

{
  byte bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  long in_FS_OFFSET;
  size_type it;
  string *ret;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee8;
  char *in_stack_fffffffffffffef0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  undefined7 in_stack_ffffffffffffff00;
  reference in_stack_ffffffffffffff08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *descriptor;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff30;
  undefined7 in_stack_ffffffffffffff38;
  char __c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a9 [3];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48 [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  __c = '\0';
  descriptor = in_RDI;
  pbVar2 = in_RDI;
  std::__cxx11::string::string(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  while (in_stack_ffffffffffffff30 =
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                        (in_stack_ffffffffffffff30,__c,(size_type)in_stack_ffffffffffffff28),
        in_stack_ffffffffffffff30 !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xffffffffffffffff) {
    in_stack_ffffffffffffff08 =
         std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                   (in_stack_fffffffffffffef8,(size_type)in_stack_fffffffffffffef0);
    *in_stack_ffffffffffffff08 = 'h';
  }
  GetDescriptorChecksum(descriptor);
  bVar1 = std::operator==(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
  std::__cxx11::string::~string(in_stack_fffffffffffffee8);
  if ((bVar1 & 1) != 0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
              (in_stack_fffffffffffffee8);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (in_RDI,(size_type)in_stack_ffffffffffffff08,CONCAT17(bVar1,in_stack_ffffffffffffff00)
              );
    __str = local_48;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (pbVar2,in_RSI);
    std::__cxx11::string::~string(in_stack_fffffffffffffee8);
    pbVar2 = local_a9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(__c,in_stack_ffffffffffffff38),(char *)in_stack_ffffffffffffff30,
               (allocator<char> *)in_stack_ffffffffffffff28);
    GetDescriptorChecksum(descriptor);
    std::operator+(in_stack_ffffffffffffff20,descriptor);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (pbVar2,__str);
    std::__cxx11::string::~string(in_stack_fffffffffffffee8);
    std::__cxx11::string::~string(in_stack_fffffffffffffee8);
    std::__cxx11::string::~string(in_stack_fffffffffffffee8);
    std::allocator<char>::~allocator((allocator<char> *)local_a9);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return descriptor;
  }
  __stack_chk_fail();
}

Assistant:

std::string UseHInsteadOfApostrophe(const std::string& desc)
{
    std::string ret = desc;
    while (true) {
        auto it = ret.find('\'');
        if (it == std::string::npos) break;
        ret[it] = 'h';
    }

    // GetDescriptorChecksum returns "" if the checksum exists but is bad.
    // Switching apostrophes with 'h' breaks the checksum if it exists - recalculate it and replace the broken one.
    if (GetDescriptorChecksum(ret) == "") {
        ret = ret.substr(0, desc.size() - 9);
        ret += std::string("#") + GetDescriptorChecksum(ret);
    }
    return ret;
}